

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void dynet::TensorTools::randomize_orthonormal(Tensor *val,real scale)

{
  uint uVar1;
  uint uVar2;
  runtime_error *prVar3;
  JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> *this;
  Dim *in_RDI;
  JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> svd;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffffd18;
  SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_> *in_stack_fffffffffffffd20;
  uint in_stack_fffffffffffffd54;
  real in_stack_fffffffffffffd58;
  real in_stack_fffffffffffffd5c;
  JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffffd60;
  float *in_stack_fffffffffffffd68;
  Tensor *in_stack_ffffffffffffff08;
  
  if (in_RDI->nd == 2) {
    uVar1 = Dim::operator[](in_RDI,0);
    uVar2 = Dim::operator[](in_RDI,1);
    if (uVar1 == uVar2) {
      if (*(int *)(*(long *)(in_RDI[1].d + 3) + 0xc) == 0) {
        randomize_uniform((Tensor *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                          in_stack_fffffffffffffd58);
        Tensor::operator*(in_stack_ffffffffffffff08);
        Eigen::Matrix<float,-1,-1,0,-1,-1>::
        Matrix<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                  (&in_stack_fffffffffffffd20->m_matrixU,
                   (EigenBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)in_stack_fffffffffffffd18);
        Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
                  (in_stack_fffffffffffffd60,
                   (MatrixType *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                   in_stack_fffffffffffffd54);
        Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<float,__1,__1,_0,__1,__1> *)0xda488d);
        this = (JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> *)
               Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>_>::
               matrixU(in_stack_fffffffffffffd20);
        Eigen::operator*(in_stack_fffffffffffffd68,(StorageBaseType *)in_stack_fffffffffffffd60);
        Tensor::operator*(in_stack_ffffffffffffff08);
        Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)this,
                   in_stack_fffffffffffffd18);
        Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(this);
        return;
      }
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Bad device type");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar3,"Attempt to set a tensor that is not a square matrix to an orthogonal matrix");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TensorTools::randomize_orthonormal(Tensor& val, real scale) {
  if (val.d.nd != 2 || val.d[0] != val.d[1])
    throw std::runtime_error("Attempt to set a tensor that is not a square matrix to an orthogonal matrix");
  if (val.device->type == DeviceType::CPU) {
    randomize_uniform(val, -1.0, 1.0);
    Eigen::JacobiSVD<Eigen::MatrixXf> svd(*val, Eigen::ComputeFullU | Eigen::ComputeThinV);
    *val = scale * svd.matrixU();
#ifdef HAVE_CUDA
  } else if (val.device->type == DeviceType::GPU) {
    DYNET_NO_CUDA_IMPL_ERROR("Orthonormal initialization");
    // TODO: The following should work, but for some reason it isn't working
    // float* t = new float[val.d.size()];
    // Tensor tt(val);
    // tt.v = t;
    // randomize_uniform(tt, -1.0, 1.0);
    // Eigen::JacobiSVD<Eigen::MatrixXf> svd(*tt, Eigen::ComputeFullU | Eigen::ComputeThinV);
    // *tt = scale * svd.matrixU();
    // CUDA_CHECK(cudaMemcpy(val.v, tt.v, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
    // delete[] t;
#endif
  } else { throw std::runtime_error("Bad device type"); }
}